

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O0

void __thiscall TIFFImageHandler::CalculateTiffTileSize(TIFFImageHandler *this,int inTileIndex)

{
  bool bVar1;
  tmsize_t tVar2;
  long local_20;
  tsize_t_compat *tbc;
  uint16_t edge;
  TIFFImageHandler *pTStack_10;
  int inTileIndex_local;
  TIFFImageHandler *this_local;
  
  tbc._2_2_ = 0;
  tbc._4_4_ = inTileIndex;
  pTStack_10 = this;
  bVar1 = TileIsRightEdge(this,inTileIndex);
  tbc._2_2_ = tbc._2_2_ | bVar1;
  bVar1 = TileIsBottomEdge(this,tbc._4_4_);
  tbc._2_2_ = tbc._2_2_ | bVar1;
  if (this->mT2p->pdf_transcode == T2P_TRANSCODE_RAW) {
    if (tbc._2_2_ == 0) {
      local_20 = 0;
      TIFFGetField(this->mT2p->input,0x145,&local_20);
      this->mT2p->tiff_datasize = *(tsize_t *)(local_20 + (long)tbc._4_4_ * 8);
    }
    else {
      tVar2 = TIFFTileSize(this->mT2p->input);
      this->mT2p->tiff_datasize = tVar2;
    }
  }
  else {
    tVar2 = TIFFTileSize(this->mT2p->input);
    this->mT2p->tiff_datasize = tVar2;
    if (this->mT2p->tiff_planar == 2) {
      this->mT2p->tiff_datasize =
           (ulong)this->mT2p->tiff_samplesperpixel * this->mT2p->tiff_datasize;
    }
  }
  return;
}

Assistant:

void TIFFImageHandler::CalculateTiffTileSize(int inTileIndex)
{
	uint16_t edge=0;

	edge |= (uint16_t)TileIsRightEdge(inTileIndex);
	edge |= (uint16_t)TileIsBottomEdge(inTileIndex);
	
	if(mT2p->pdf_transcode==T2P_TRANSCODE_RAW)
	{
		if(edge)
		{
			mT2p->tiff_datasize=TIFFTileSize(mT2p->input);
		} else 
		{
			// 	TIFFTAG_TILEBYTECOUNTS changed in tiff 4.0.0;

			tsize_t_compat* tbc = NULL;
			TIFFGetField(mT2p->input, TIFFTAG_TILEBYTECOUNTS, &tbc);
			mT2p->tiff_datasize=static_cast<tsize_t>(tbc[inTileIndex]);
		}
	}
	else
	{
		mT2p->tiff_datasize=TIFFTileSize(mT2p->input);
		if(mT2p->tiff_planar==PLANARCONFIG_SEPARATE)
			mT2p->tiff_datasize*= mT2p->tiff_samplesperpixel;
	}
}